

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O1

Ptr<Device> __thiscall
myvk::Device::Create
          (Device *this,Ptr<PhysicalDevice> *physical_device,QueueSelectorFunc *queue_selector_func,
          PhysicalDeviceFeatures *features,
          vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  Device *pDVar1;
  VkPhysicalDeviceVulkan11Features *pVVar2;
  VkPhysicalDeviceVulkan12Features *__dest;
  VkPhysicalDeviceVulkan13Features *pVVar3;
  void *pvVar4;
  undefined4 uVar5;
  element_type *peVar6;
  VkBool32 VVar7;
  VkBool32 VVar8;
  VkBool32 VVar9;
  VkBool32 VVar10;
  VkBool32 VVar11;
  VkBool32 VVar12;
  VkBool32 VVar13;
  VkBool32 VVar14;
  VkBool32 VVar15;
  VkBool32 VVar16;
  VkBool32 VVar17;
  VkBool32 VVar18;
  PhysicalDeviceFeatures *pPVar19;
  PhysicalDeviceFeatures *pPVar20;
  VkResult VVar21;
  element_type *peVar22;
  undefined8 uVar23;
  long lVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var25;
  VkPhysicalDeviceVulkan13Features *pVVar26;
  VkPhysicalDeviceVulkan13Features *pVVar27;
  byte bVar28;
  Ptr<Device> PVar29;
  shared_ptr<myvk::Device> ret;
  vector<float,_std::allocator<float>_> queue_priorities;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> queue_create_infos;
  vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_> queue_selections;
  QueueSelectionResolver queue_resolver;
  Ptr<Device> local_148;
  PhysicalDeviceFeatures *local_130;
  vector<float,_std::allocator<float>_> local_128;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> local_108;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_f0;
  Device *local_e8;
  vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_> local_e0;
  undefined1 local_c8 [40];
  char **ppcStack_a0;
  ulong local_98;
  pointer ppcStack_90;
  PhysicalDeviceFeatures *local_88;
  QueueSelectionResolver local_78;
  
  bVar28 = 0;
  local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_130 = features;
  local_f0 = extensions;
  local_e8 = this;
  peVar22 = (element_type *)operator_new(0x290);
  (peVar22->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x100000001;
  peVar22->_vptr_Base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0032f3e8;
  pDVar1 = (Device *)
           &(peVar22->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
            super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  memset(pDVar1,0,0x280);
  (peVar22->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__Device_0032f3b0;
  memset(&peVar22[1].super_enable_shared_from_this<myvk::Base>._M_weak_this.
          super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0,0xec);
  *(undefined4 *)
   &peVar22[0xb].super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 0x31;
  peVar22[0xc]._vptr_Base = (_func_int **)&peVar22[0xe].super_enable_shared_from_this<myvk::Base>;
  peVar22[0xc].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peVar22[0xc].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar22[0xd]._vptr_Base = (_func_int **)0x0;
  peVar22[0xd].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peVar22[0xd].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar22[0xe]._vptr_Base = (_func_int **)0x0;
  *(undefined4 *)
   &peVar22[0xe].super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0x33;
  peVar22[0xe].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar22 + 0x17);
  memset(peVar22 + 0xf,0,0xbc);
  *(undefined4 *)&peVar22[0x17]._vptr_Base = 0x35;
  peVar22[0x17].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peVar22[0x17].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar22[0x18]._vptr_Base = (_func_int **)0x0;
  peVar22[0x18].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peVar22[0x18].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar22[0x19]._vptr_Base = (_func_int **)0x0;
  peVar22[0x19].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peVar22[0x19].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)&peVar22[0x1a]._vptr_Base = 0;
  peVar22[0x1a].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peVar22[0x1a].super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar22[0x1b]._vptr_Base = (_func_int **)0x0;
  local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pDVar1;
  local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar22;
  std::__shared_ptr<myvk::Device,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<myvk::Device,myvk::Device>
            ((__shared_ptr<myvk::Device,(__gnu_cxx::_Lock_policy)2> *)&local_148,pDVar1);
  ((local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_physical_device_ptr).super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (physical_device->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&((local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_physical_device_ptr).
              super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(physical_device->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  local_c8._0_8_ =
       (physical_device->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_c8._8_8_ =
       (physical_device->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count + 1;
    }
  }
  if ((queue_selector_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
    uVar23 = std::__throw_bad_function_call();
    std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>::~vector(&local_e0);
    if ((element_type *)
        local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    _Unwind_Resume(uVar23);
  }
  (*queue_selector_func->_M_invoker)
            (&local_e0,(_Any_data *)queue_selector_func,
             (shared_ptr<const_myvk::PhysicalDevice> *)local_c8);
  pDVar1 = local_e8;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  if (local_e0.super__Vector_base<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_e0.super__Vector_base<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (pDVar1->super_Base)._vptr_Base = (_func_int **)0x0;
    (pDVar1->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    goto LAB_001acc7f;
  }
  QueueSelectionResolver::QueueSelectionResolver(&local_78,physical_device,&local_e0);
  local_108.super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  QueueSelectionResolver::EnumerateDeviceQueueCreateInfos(&local_78,&local_108,&local_128);
  pPVar19 = local_130;
  ppcStack_a0 = (char **)0x0;
  local_c8._0_8_ = (element_type *)0x3;
  local_c8._24_8_ =
       local_108.
       super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_c8._16_8_ =
       (ulong)(uint)((int)((ulong)((long)local_108.
                                         super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_108.
                                        super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x33333333) << 0x20;
  local_88 = local_130;
  ppcStack_90 = (local_f0->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_98 = (ulong)((long)(local_f0->
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)ppcStack_90) >> 3 & 0xffffffff;
  local_c8._32_8_ = (void *)0x0;
  pVVar2 = &local_130->vk11;
  local_c8._8_8_ = pVVar2;
  VVar21 = (*vkCreateDevice)((((local_148.
                                super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->m_physical_device_ptr).
                              super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->m_physical_device,(VkDeviceCreateInfo *)local_c8,
                             (VkAllocationCallbacks *)0x0,
                             &(local_148.
                               super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->m_device);
  if (VVar21 == VK_SUCCESS) {
    volkLoadDevice((local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_device);
    VVar21 = create_allocator(local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    if (VVar21 != VK_SUCCESS) goto LAB_001acc25;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8._16_8_ = 0;
    local_c8._24_8_ = (pointer)0x0;
    local_c8._32_8_ = (void *)0x0;
    local_c8._0_8_ = (element_type *)0x11;
    VVar21 = (*vkCreatePipelineCache)
                       ((local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_device,(VkPipelineCacheCreateInfo *)local_c8,
                        (VkAllocationCallbacks *)0x0,
                        &(local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_pipeline_cache);
    pPVar20 = local_130;
    peVar6 = local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (VVar21 != VK_SUCCESS) goto LAB_001acc25;
    memcpy(&(local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_features,local_130,0xdc);
    uVar5 = *(undefined4 *)&pVVar2->field_0x4;
    pvVar4 = (pPVar19->vk11).pNext;
    VVar7 = (pPVar19->vk11).storageBuffer16BitAccess;
    VVar8 = (pPVar19->vk11).uniformAndStorageBuffer16BitAccess;
    VVar9 = (pPVar19->vk11).storagePushConstant16;
    VVar10 = (pPVar19->vk11).storageInputOutput16;
    VVar11 = (pPVar19->vk11).multiview;
    VVar12 = (pPVar19->vk11).multiviewGeometryShader;
    VVar13 = (pPVar19->vk11).multiviewTessellationShader;
    VVar14 = (pPVar19->vk11).variablePointersStorageBuffer;
    VVar15 = (pPVar19->vk11).variablePointers;
    VVar16 = (pPVar19->vk11).protectedMemory;
    VVar17 = (pPVar19->vk11).samplerYcbcrConversion;
    VVar18 = (pPVar19->vk11).shaderDrawParameters;
    (peVar6->m_features).vk11.sType = pVVar2->sType;
    *(undefined4 *)&(peVar6->m_features).vk11.field_0x4 = uVar5;
    (peVar6->m_features).vk11.pNext = pvVar4;
    (peVar6->m_features).vk11.storageBuffer16BitAccess = VVar7;
    (peVar6->m_features).vk11.uniformAndStorageBuffer16BitAccess = VVar8;
    (peVar6->m_features).vk11.storagePushConstant16 = VVar9;
    (peVar6->m_features).vk11.storageInputOutput16 = VVar10;
    (peVar6->m_features).vk11.multiview = VVar11;
    (peVar6->m_features).vk11.multiviewGeometryShader = VVar12;
    (peVar6->m_features).vk11.multiviewTessellationShader = VVar13;
    (peVar6->m_features).vk11.variablePointersStorageBuffer = VVar14;
    (peVar6->m_features).vk11.variablePointers = VVar15;
    (peVar6->m_features).vk11.protectedMemory = VVar16;
    (peVar6->m_features).vk11.samplerYcbcrConversion = VVar17;
    (peVar6->m_features).vk11.shaderDrawParameters = VVar18;
    __dest = &(peVar6->m_features).vk12;
    memcpy(__dest,&pPVar20->vk12,0xd0);
    pVVar3 = &(peVar6->m_features).vk13;
    pVVar26 = &pPVar20->vk13;
    pVVar27 = pVVar3;
    for (lVar24 = 10; lVar24 != 0; lVar24 = lVar24 + -1) {
      uVar5 = *(undefined4 *)&pVVar26->field_0x4;
      pVVar27->sType = pVVar26->sType;
      *(undefined4 *)&pVVar27->field_0x4 = uVar5;
      pVVar26 = (VkPhysicalDeviceVulkan13Features *)((long)pVVar26 + (ulong)bVar28 * -0x10 + 8);
      pVVar27 = (VkPhysicalDeviceVulkan13Features *)((long)pVVar27 + (ulong)bVar28 * -0x10 + 8);
    }
    (peVar6->m_features).vk11.pNext = __dest;
    (peVar6->m_features).vk12.pNext = pVVar3;
    (peVar6->m_features).vk13.pNext = (void *)0x0;
    QueueSelectionResolver::FetchDeviceQueues(&local_78,&local_148);
    _Var25._M_pi = local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    (pDVar1->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pDVar1->super_Base)._vptr_Base =
         (_func_int **)local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (pDVar1->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var25._M_pi;
    local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Device *)0x0;
  }
  else {
LAB_001acc25:
    (pDVar1->super_Base)._vptr_Base = (_func_int **)0x0;
    (pDVar1->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.
      super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
  ::~_Rb_tree(&local_78.m_queue_creations._M_t);
  std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>::~vector
            (&local_78.m_queue_selections);
LAB_001acc7f:
  std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>::~vector(&local_e0);
  _Var25._M_pi = extraout_RDX;
  if ((element_type *)
      local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var25._M_pi = extraout_RDX_00;
  }
  PVar29.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var25._M_pi;
  PVar29.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pDVar1;
  return (Ptr<Device>)PVar29.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Device> Device::Create(const Ptr<PhysicalDevice> &physical_device, const QueueSelectorFunc& queue_selector_func,
                           const PhysicalDeviceFeatures &features, const std::vector<const char *> &extensions) {
	auto ret = std::make_shared<Device>();
	ret->m_physical_device_ptr = physical_device;

	std::vector<QueueSelection> queue_selections = queue_selector_func(physical_device);
	if (queue_selections.empty())
		return nullptr;
	QueueSelectionResolver queue_resolver{physical_device, std::move(queue_selections)};
	std::vector<VkDeviceQueueCreateInfo> queue_create_infos;
	std::vector<float> queue_priorities;
	queue_resolver.EnumerateDeviceQueueCreateInfos(&queue_create_infos, &queue_priorities);

	if (ret->create_device(queue_create_infos, extensions, features) != VK_SUCCESS)
		return nullptr;
	volkLoadDevice(ret->m_device);
	if (ret->create_allocator() != VK_SUCCESS)
		return nullptr;
	if (ret->create_pipeline_cache() != VK_SUCCESS)
		return nullptr;
	ret->m_features = features;
	queue_resolver.FetchDeviceQueues(ret);
	return ret;
}